

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall Lexer::add_token_comment(Lexer *this)

{
  bool bVar1;
  ulong uVar2;
  uchar *__first;
  long lVar3;
  long lVar4;
  reference pvVar5;
  size_type sVar6;
  TextPos *args_1;
  size_type local_40;
  unsigned_long local_38;
  TokenKind local_2c;
  uchar *local_28;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  const_iterator local_18;
  Lexer *local_10;
  Lexer *this_local;
  
  local_10 = this;
  trim_string(&this->tok_id);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_20._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            (&(this->data).comments);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_18,&local_20);
    __first = (uchar *)std::__cxx11::string::operator[]((ulong)&this->tok_id);
    lVar3 = std::__cxx11::string::operator[]((ulong)&this->tok_id);
    lVar4 = std::__cxx11::string::size();
    local_28 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<unsigned_char*,void>
                                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                   &(this->data).comments,local_18,__first,(uchar *)(lVar3 + lVar4))
    ;
    bVar1 = std::vector<Token,_std::allocator<Token>_>::empty(&(this->data).tokens);
    if ((bVar1) ||
       (pvVar5 = std::vector<Token,_std::allocator<Token>_>::back(&(this->data).tokens),
       pvVar5->kind != Comment)) {
      local_2c = Comment;
      args_1 = CharReader::pos(&this->reader);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&(this->data).comments);
      lVar3 = std::__cxx11::string::size();
      local_38 = sVar6 - lVar3;
      local_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           (&(this->data).comments);
      LexData::add_token<TokenKind,TextPos_const&,unsigned_long,unsigned_long>
                (&this->data,&local_2c,args_1,&local_38,&local_40);
    }
    else {
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&(this->data).comments);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::back(&(this->data).tokens);
      pvVar5->j = (int)sVar6;
    }
    std::__cxx11::string::clear();
    return;
  }
  return;
}

Assistant:

void Lexer::add_token_comment()
{
  trim_string(tok_id);
  if (!tok_id.empty()) {
    data.comments.insert(data.comments.end(),
                         (uint8_t*)&tok_id[0],
                         (uint8_t*)&tok_id[0]+tok_id.size());

    // Merge comments
    if (!data.tokens.empty() &&
        data.tokens.back().kind == TokenKind::Comment) {
      data.tokens.back().j = data.comments.size();
    }
    else {
      data.add_token(TokenKind::Comment,
                     reader.pos(),
                     data.comments.size()-tok_id.size(),
                     data.comments.size());
    }

    tok_id.clear();
  }
}